

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int query_attr(attr_list list,atom_t attr_id,attr_value_type *val_type_p,attr_value *value_p)

{
  ulong uVar1;
  int_attr *piVar2;
  int_attr_struct *piVar3;
  attr_p paVar4;
  int iVar5;
  undefined4 uVar6;
  long lVar7;
  ulong uVar8;
  int i;
  long lVar9;
  
  if (list == (attr_list)0x0) {
    return 0;
  }
  if (list->list_of_lists != 0) {
    lVar9 = 0;
    do {
      if ((list->l).lists.sublist_count <= lVar9) {
        return 0;
      }
      iVar5 = query_attr((list->l).lists.lists[lVar9],attr_id,val_type_p,value_p);
      lVar9 = lVar9 + 1;
    } while (iVar5 == 0);
    return 1;
  }
  piVar3 = (list->l).list.iattrs;
  uVar8 = 0;
  do {
    if (piVar3->int_attr_count == uVar8) {
      lVar9 = 0;
      do {
        lVar7 = lVar9;
        if ((ulong)piVar3->other_attr_count * 0x18 + 0x18 == lVar7 + 0x18) {
          return 0;
        }
        paVar4 = (list->l).list.attributes;
        lVar9 = lVar7 + 0x18;
      } while (*(int *)((long)&paVar4->attr_id + lVar7) != attr_id);
      if (val_type_p != (attr_value_type *)0x0) {
        *val_type_p = *(attr_value_type *)((long)&paVar4->val_type + lVar7);
      }
      if (value_p == (attr_value *)0x0) {
        return 1;
      }
      paVar4 = (list->l).list.attributes;
      if (*(int *)((long)&paVar4->val_type + lVar7) != 1) {
        *value_p = *(attr_value *)((long)&(paVar4->value).u + lVar7);
        return 1;
      }
      uVar6 = *(undefined4 *)((long)&(paVar4->value).u + lVar7);
      goto LAB_00104c26;
    }
    uVar1 = uVar8 + 1;
    piVar2 = piVar3->iattr + uVar8;
    uVar8 = uVar1;
  } while (piVar2->attr_id != attr_id);
  if (val_type_p != (attr_value_type *)0x0) {
    *val_type_p = Attr_Int4;
  }
  if (value_p == (attr_value *)0x0) {
    return 1;
  }
  uVar6 = *(undefined4 *)((list->l).lists.lists + uVar1);
LAB_00104c26:
  *(undefined4 *)value_p = uVar6;
  return 1;
}

Assistant:

extern int
query_attr(attr_list list, atom_t attr_id, attr_value_type *val_type_p, attr_value *value_p)
{
    if (list == NULL) return 0;
    if (list->list_of_lists) {
        int i;
        for (i=0; i< list->l.lists.sublist_count; i++) {
            if (query_attr(list->l.lists.lists[i], attr_id, val_type_p,
                           value_p)) {
                return 1;
            }
        }
        return 0;
    } else {
	int index = 0;
	while(index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = Attr_Int4;
		}
		if (value_p != NULL) {
		    if (sizeof(long) != 4){
			*((int*)value_p) = (int)(long)list->l.list.iattrs->iattr[index].value;
		    } else {
			*((int*)value_p) = list->l.list.iattrs->iattr[index].value;
		    }
		}
		return 1;
	    }
	    index++;
        }
	index = 0;
	while(index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = list->l.list.attributes[index].val_type;
		}
		if (value_p != NULL) {
		    if ((sizeof(long) != 4) &&
			(list->l.list.attributes[index].val_type == Attr_Int4)){
			*((int*)value_p) = (int)(long)list->l.list.attributes[index].value.u.i;
		    } else {
			*value_p = list->l.list.attributes[index].value.u.l;
		    }
		}
		return 1;
	    }
	    index++;
        }
        return 0;
    }                 
}